

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  _func_int *p_Var10;
  long lVar11;
  size_t sVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int *piVar20;
  void *pvVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  float *pfVar32;
  long lVar33;
  void *pvVar34;
  void *pvVar35;
  long lVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  undefined4 *puVar47;
  uint uVar48;
  int iVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  float *pfVar53;
  undefined1 (*pauVar54) [16];
  long lVar55;
  bool bVar56;
  undefined1 extraout_var [12];
  undefined1 auVar57 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  v4sf one;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [12];
  undefined8 uVar76;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  int inh;
  int elempack;
  ulong local_1e0;
  ulong local_1d8;
  void *local_1b8;
  ulong local_1b0;
  void *local_1a8;
  long local_180;
  long local_178;
  long local_158;
  Mat local_108;
  ulong local_b8;
  ulong local_b0;
  undefined8 local_a8;
  void *local_a0;
  ulong local_98;
  ulong local_90;
  undefined1 local_88 [16];
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  void *local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar30 = bottom_blob->elemsize;
  iVar7 = bottom_blob->elempack;
  p_Var10 = this->_vptr_Convolution1D_x86[-3];
  iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var10);
  iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var10);
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86 + (long)this->_vptr_Convolution1D_x86[-3]),
             bottom_blob,&local_108,opt);
  iVar43 = -100;
  if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
    uVar48 = 1;
    if (opt->use_packing_layout == true) {
      uVar48 = (uint)(((&this->field_0xd0)[(long)this->_vptr_Convolution1D_x86[-3]] & 3) == 0) * 3 +
               1;
    }
    Mat::create(top_blob,(local_108.w + ~((iVar8 + -1) * iVar9)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]) + 1,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / (int)uVar48,
                (ulong)uVar48 * (uVar30 / (ulong)(long)iVar7),uVar48,opt->blob_allocator);
    iVar7 = local_108.elempack;
    auVar72 = _DAT_00596120;
    auVar78 = _DAT_00596110;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var10 = this->_vptr_Convolution1D_x86[-3];
      iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var10);
      uVar48 = *(uint *)(&this->field_0xf4 + (long)p_Var10);
      local_90 = (ulong)uVar48;
      iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var10);
      lVar52 = (long)iVar9;
      iVar43 = *(int *)(&this->field_0xdc + (long)p_Var10);
      lVar27 = (long)iVar43;
      uVar22 = local_108.h * local_108.elempack;
      iVar23 = local_108.w * local_108.elempack;
      local_98 = (ulong)(uint)top_blob->w;
      local_b8 = (long)top_blob->h * (long)top_blob->elempack;
      iVar25 = (int)local_b8;
      iVar49 = iVar25 + 3;
      if (-1 < iVar25) {
        iVar49 = iVar25;
      }
      lVar11 = *(long *)(&this->field_0x190 + (long)p_Var10);
      uVar45 = iVar49 >> 2;
      lVar40 = (long)iVar23;
      if (3 < iVar25) {
        lVar33 = (long)top_blob->elempack * (long)top_blob->w;
        iVar49 = (int)lVar33;
        lVar28 = (long)(iVar49 * 2);
        local_88._0_8_ = lVar28;
        local_1e0 = 0;
        fVar94 = (float)DAT_00596110;
        fVar95 = DAT_00596110._4_4_;
        fVar96 = DAT_00596110._8_4_;
        fVar97 = DAT_00596110._12_4_;
        fVar59 = (float)DAT_00596120;
        fVar60 = DAT_00596120._4_4_;
        fVar61 = DAT_00596120._8_4_;
        fVar62 = DAT_00596120._12_4_;
        do {
          lVar29 = (long)top_blob->w;
          if (0 < lVar29) {
            uVar46 = local_108.h * local_108.elempack;
            iVar26 = top_blob->elempack;
            pauVar54 = (undefined1 (*) [16])
                       ((int)((long)((ulong)(uint)((int)(local_1e0 * 4) >> 0x1f) << 0x20 |
                                    local_1e0 * 4 & 0xffffffff) / (long)iVar26) * lVar29 *
                        top_blob->elemsize + (long)top_blob->data);
            local_180 = 0;
            iVar44 = 0;
            local_178 = 0;
            local_1b8 = (void *)(lVar40 * 4);
            do {
              fVar102 = 0.0;
              fVar103 = 0.0;
              fVar104 = 0.0;
              fVar105 = 0.0;
              fVar88 = 0.0;
              fVar91 = 0.0;
              fVar92 = 0.0;
              fVar93 = 0.0;
              if (lVar11 != 0) {
                pfVar53 = (float *)(lVar11 + local_1e0 * 0x10);
                fVar88 = *pfVar53;
                fVar91 = pfVar53[1];
                fVar92 = pfVar53[2];
                fVar93 = pfVar53[3];
              }
              pfVar53 = (float *)((this->weight_data_tm).cstep * local_1e0 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              uVar30 = 0;
              if ((int)uVar46 < 4) {
                fVar81 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar87 = 0.0;
                fVar98 = 0.0;
                fVar99 = 0.0;
                fVar100 = 0.0;
                fVar101 = 0.0;
              }
              else {
                fVar98 = 0.0;
                fVar99 = 0.0;
                fVar100 = 0.0;
                fVar101 = 0.0;
                fVar81 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar87 = 0.0;
                iVar42 = 0;
                do {
                  lVar36 = (long)(iVar42 / local_108.elempack) *
                           (long)local_108.w *
                           CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
                  pfVar37 = (float *)((long)local_108.data +
                                     lVar36 + (long)(iVar43 * local_108.elempack * (int)local_178) *
                                              4);
                  if ((local_108.elempack == 4) && (0 < iVar8)) {
                    pfVar37 = (float *)((long)local_108.data + lVar36 + (long)iVar44 * 4);
                    iVar41 = iVar8;
                    do {
                      fVar1 = *pfVar37;
                      fVar2 = pfVar37[1];
                      fVar3 = pfVar37[2];
                      fVar4 = pfVar37[3];
                      fVar88 = fVar88 + fVar1 * *pfVar53;
                      fVar91 = fVar91 + fVar1 * pfVar53[1];
                      fVar92 = fVar92 + fVar1 * pfVar53[2];
                      fVar93 = fVar93 + fVar1 * pfVar53[3];
                      fVar98 = fVar98 + fVar2 * pfVar53[4];
                      fVar99 = fVar99 + fVar2 * pfVar53[5];
                      fVar100 = fVar100 + fVar2 * pfVar53[6];
                      fVar101 = fVar101 + fVar2 * pfVar53[7];
                      fVar81 = fVar81 + fVar3 * pfVar53[8];
                      fVar85 = fVar85 + fVar3 * pfVar53[9];
                      fVar86 = fVar86 + fVar3 * pfVar53[10];
                      fVar87 = fVar87 + fVar3 * pfVar53[0xb];
                      fVar102 = fVar102 + fVar4 * pfVar53[0xc];
                      fVar103 = fVar103 + fVar4 * pfVar53[0xd];
                      fVar104 = fVar104 + fVar4 * pfVar53[0xe];
                      fVar105 = fVar105 + fVar4 * pfVar53[0xf];
                      pfVar53 = pfVar53 + 0x10;
                      pfVar37 = pfVar37 + iVar9 * 4;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  if ((local_108.elempack == 1) && (iVar41 = iVar8, 0 < iVar8)) {
                    do {
                      fVar1 = *pfVar37;
                      fVar88 = fVar88 + fVar1 * *pfVar53;
                      fVar91 = fVar91 + fVar1 * pfVar53[1];
                      fVar92 = fVar92 + fVar1 * pfVar53[2];
                      fVar93 = fVar93 + fVar1 * pfVar53[3];
                      fVar1 = pfVar37[lVar40];
                      fVar98 = fVar98 + fVar1 * pfVar53[4];
                      fVar99 = fVar99 + fVar1 * pfVar53[5];
                      fVar100 = fVar100 + fVar1 * pfVar53[6];
                      fVar101 = fVar101 + fVar1 * pfVar53[7];
                      fVar1 = pfVar37[iVar23 * 2];
                      fVar81 = fVar81 + fVar1 * pfVar53[8];
                      fVar85 = fVar85 + fVar1 * pfVar53[9];
                      fVar86 = fVar86 + fVar1 * pfVar53[10];
                      fVar87 = fVar87 + fVar1 * pfVar53[0xb];
                      fVar1 = pfVar37[iVar23 * 3];
                      fVar102 = fVar102 + fVar1 * pfVar53[0xc];
                      fVar103 = fVar103 + fVar1 * pfVar53[0xd];
                      fVar104 = fVar104 + fVar1 * pfVar53[0xe];
                      fVar105 = fVar105 + fVar1 * pfVar53[0xf];
                      pfVar53 = pfVar53 + 0x10;
                      pfVar37 = pfVar37 + lVar52;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  iVar41 = iVar42 + 7;
                  iVar42 = iVar42 + 4;
                } while (iVar41 < (int)uVar46);
                uVar30 = (ulong)uVar46 & 0xfffffffc;
              }
              uVar24 = (uint)uVar30;
              if ((int)(uVar24 | 1) < (int)uVar46) {
                lVar36 = (long)local_108.w *
                         CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
                lVar50 = lVar36 * uVar30;
                lVar55 = (long)local_108.data + lVar50 + (long)local_1b8;
                lVar36 = lVar36 * 2;
                lVar50 = (long)local_108.data + lVar50 + local_180;
                do {
                  if (0 < iVar8) {
                    lVar51 = 0;
                    iVar42 = iVar8;
                    do {
                      fVar1 = *(float *)(lVar50 + lVar51);
                      fVar88 = fVar88 + fVar1 * *pfVar53;
                      fVar91 = fVar91 + fVar1 * pfVar53[1];
                      fVar92 = fVar92 + fVar1 * pfVar53[2];
                      fVar93 = fVar93 + fVar1 * pfVar53[3];
                      fVar1 = *(float *)(lVar55 + lVar51);
                      fVar98 = fVar98 + fVar1 * pfVar53[4];
                      fVar99 = fVar99 + fVar1 * pfVar53[5];
                      fVar100 = fVar100 + fVar1 * pfVar53[6];
                      fVar101 = fVar101 + fVar1 * pfVar53[7];
                      pfVar53 = pfVar53 + 8;
                      lVar51 = lVar51 + lVar52 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar30 = uVar30 + 2;
                  uVar24 = (uint)uVar30;
                  lVar55 = lVar55 + lVar36;
                  lVar50 = lVar50 + lVar36;
                } while ((int)(uVar24 | 1) < (int)uVar46);
              }
              if ((int)uVar24 < (int)uVar46) {
                lVar36 = (long)local_108.w *
                         CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
                uVar30 = (ulong)uVar24;
                pfVar37 = (float *)(lVar36 * uVar30 + local_180 + (long)local_108.data);
                do {
                  pfVar31 = pfVar37;
                  iVar42 = iVar8;
                  if (0 < iVar8) {
                    do {
                      fVar1 = *pfVar31;
                      fVar88 = fVar88 + fVar1 * *pfVar53;
                      fVar91 = fVar91 + fVar1 * pfVar53[1];
                      fVar92 = fVar92 + fVar1 * pfVar53[2];
                      fVar93 = fVar93 + fVar1 * pfVar53[3];
                      pfVar53 = pfVar53 + 4;
                      pfVar31 = pfVar31 + lVar52;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar30 = uVar30 + 1;
                  pfVar37 = (float *)((long)pfVar37 + lVar36);
                } while ((int)uVar30 < (int)uVar46);
              }
              fVar88 = fVar81 + fVar102 + fVar98 + fVar88;
              fVar91 = fVar85 + fVar103 + fVar99 + fVar91;
              auVar83._0_8_ = CONCAT44(fVar91,fVar88);
              auVar83._8_4_ = fVar86 + fVar104 + fVar100 + fVar92;
              auVar83._12_4_ = fVar87 + fVar105 + fVar101 + fVar93;
              switch(uVar48) {
              case 1:
                auVar83 = maxps(auVar83,ZEXT816(0));
                break;
              case 2:
                auVar68._8_4_ = auVar83._8_4_;
                auVar68._0_8_ = auVar83._0_8_;
                auVar68._12_4_ = auVar83._12_4_;
                auVar69 = maxps(auVar68,ZEXT816(0));
                auVar84 = minps(auVar83,ZEXT816(0));
                fVar88 = **(float **)(&this->field_0xf8 + (long)p_Var10);
                auVar83._4_4_ = fVar88 * auVar84._4_4_ + auVar69._4_4_;
                auVar83._0_4_ = fVar88 * auVar84._0_4_ + auVar69._0_4_;
                auVar83._8_4_ = fVar88 * auVar84._8_4_ + auVar69._8_4_;
                auVar83._12_4_ = fVar88 * auVar84._12_4_ + auVar69._12_4_;
                break;
              case 3:
                uVar5 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var10);
                uVar6 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var10))[1];
                auVar66._4_4_ = uVar5;
                auVar66._0_4_ = uVar5;
                auVar66._8_4_ = uVar5;
                auVar66._12_4_ = uVar5;
                auVar83 = maxps(auVar83,auVar66);
                auVar15._4_4_ = uVar6;
                auVar15._0_4_ = uVar6;
                auVar15._8_4_ = uVar6;
                auVar15._12_4_ = uVar6;
                auVar83 = minps(auVar83,auVar15);
                break;
              case 4:
                auVar82._0_8_ = CONCAT44(fVar91,fVar88) ^ 0x8000000080000000;
                auVar82._8_4_ = -auVar83._8_4_;
                auVar82._12_4_ = -auVar83._12_4_;
                auVar83 = minps(auVar82,_DAT_005960e0);
                auVar83 = maxps(auVar83,_DAT_005960f0);
                fVar91 = auVar83._0_4_ * 1.442695 + fVar94;
                fVar93 = auVar83._4_4_ * 1.442695 + fVar95;
                fVar103 = auVar83._8_4_ * 1.442695 + fVar96;
                fVar105 = auVar83._12_4_ * 1.442695 + fVar97;
                fVar88 = (float)(int)fVar91;
                fVar92 = (float)(int)fVar93;
                fVar102 = (float)(int)fVar103;
                fVar104 = (float)(int)fVar105;
                fVar88 = fVar88 - (float)(-(uint)(fVar91 < fVar88) & (uint)fVar59);
                fVar92 = fVar92 - (float)(-(uint)(fVar93 < fVar92) & (uint)fVar60);
                fVar102 = fVar102 - (float)(-(uint)(fVar103 < fVar102) & (uint)fVar61);
                fVar104 = fVar104 - (float)(-(uint)(fVar105 < fVar104) & (uint)fVar62);
                fVar91 = fVar88 * -0.6931472 + auVar83._0_4_;
                fVar93 = fVar92 * -0.6931472 + auVar83._4_4_;
                fVar103 = fVar102 * -0.6931472 + auVar83._8_4_;
                fVar105 = fVar104 * -0.6931472 + auVar83._12_4_;
                auVar67._0_4_ =
                     fVar91 + fVar59 +
                     (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                       0.041665796) * fVar91 + 0.16666666) * fVar91 + fVar94) * fVar91 * fVar91;
                auVar67._4_4_ =
                     fVar93 + fVar60 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar95) * fVar93 * fVar93;
                auVar67._8_4_ =
                     fVar103 + fVar61 +
                     (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103
                       + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar96) *
                     fVar103 * fVar103;
                auVar67._12_4_ =
                     fVar105 + fVar62 +
                     (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105
                       + 0.041665796) * fVar105 + 0.16666666) * fVar105 + fVar97) *
                     fVar105 * fVar105;
                fVar103 = (float)((int)fVar88 * 0x800000 + (int)fVar59) * auVar67._0_4_ + fVar59;
                fVar105 = (float)((int)fVar92 * 0x800000 + (int)fVar60) * auVar67._4_4_ + fVar60;
                fVar102 = (float)((int)fVar102 * 0x800000 + (int)fVar61) * auVar67._8_4_ + fVar61;
                fVar104 = (float)((int)fVar104 * 0x800000 + (int)fVar62) * auVar67._12_4_ + fVar62;
                auVar14._4_4_ = fVar105;
                auVar14._0_4_ = fVar103;
                auVar14._8_4_ = fVar102;
                auVar14._12_4_ = fVar104;
                auVar83 = rcpps(auVar67,auVar14);
                fVar88 = auVar83._0_4_;
                fVar91 = auVar83._4_4_;
                fVar92 = auVar83._8_4_;
                fVar93 = auVar83._12_4_;
                auVar83._0_4_ = (fVar59 - fVar103 * fVar88) * fVar88 + fVar88;
                auVar83._4_4_ = (fVar60 - fVar105 * fVar91) * fVar91 + fVar91;
                auVar83._8_4_ = (fVar61 - fVar102 * fVar92) * fVar92 + fVar92;
                auVar83._12_4_ = (fVar62 - fVar104 * fVar93) * fVar93 + fVar93;
                break;
              case 5:
                auVar63._8_4_ = auVar83._8_4_;
                auVar63._0_8_ = auVar83._0_8_;
                auVar63._12_4_ = auVar83._12_4_;
                auVar69 = minps(auVar63,_DAT_005960e0);
                auVar69 = maxps(auVar69,_DAT_005960f0);
                fVar92 = auVar69._0_4_ * 1.442695 + fVar94;
                fVar93 = auVar69._4_4_ * 1.442695 + fVar95;
                fVar102 = auVar69._8_4_ * 1.442695 + fVar96;
                fVar103 = auVar69._12_4_ * 1.442695 + fVar97;
                fVar104 = (float)(int)fVar92;
                fVar105 = (float)(int)fVar93;
                fVar81 = (float)(int)fVar102;
                fVar85 = (float)(int)fVar103;
                fVar104 = fVar104 - (float)(-(uint)(fVar92 < fVar104) & (uint)fVar59);
                fVar105 = fVar105 - (float)(-(uint)(fVar93 < fVar105) & (uint)fVar60);
                fVar81 = fVar81 - (float)(-(uint)(fVar102 < fVar81) & (uint)fVar61);
                fVar85 = fVar85 - (float)(-(uint)(fVar103 < fVar85) & (uint)fVar62);
                fVar92 = auVar69._0_4_ - fVar104 * 0.6931472;
                fVar93 = auVar69._4_4_ - fVar105 * 0.6931472;
                fVar102 = auVar69._8_4_ - fVar81 * 0.6931472;
                fVar103 = auVar69._12_4_ - fVar85 * 0.6931472;
                auVar89._0_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)fVar59) *
                     (fVar92 + fVar59 +
                     (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                       0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar94) * fVar92 * fVar92) +
                     fVar59;
                auVar89._4_4_ =
                     (float)((int)fVar105 * 0x800000 + (int)fVar60) *
                     (fVar93 + fVar60 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar95) * fVar93 * fVar93) +
                     fVar60;
                auVar89._8_4_ =
                     (float)((int)fVar81 * 0x800000 + (int)fVar61) *
                     (fVar102 + fVar61 +
                     (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                       + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar96) *
                     fVar102 * fVar102) + fVar61;
                auVar89._12_4_ =
                     (float)((int)fVar85 * 0x800000 + (int)fVar62) *
                     (fVar103 + fVar62 +
                     (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103
                       + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar97) *
                     fVar103 * fVar103) + fVar62;
                auVar69 = maxps(auVar89,_DAT_00596190);
                auVar90._0_8_ = auVar69._0_8_ & 0x807fffff807fffff;
                auVar90._8_4_ = auVar69._8_4_ & 0x807fffff;
                auVar90._12_4_ = auVar69._12_4_ & 0x807fffff;
                auVar90 = auVar90 | auVar78;
                fVar92 = auVar90._0_4_;
                fVar102 = auVar90._4_4_;
                fVar104 = auVar90._8_4_;
                fVar81 = auVar90._12_4_;
                fVar93 = fVar92 + (float)DAT_005961d0 +
                         (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
                fVar103 = fVar102 + DAT_005961d0._4_4_ +
                          (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
                fVar105 = fVar104 + DAT_005961d0._8_4_ +
                          (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
                fVar85 = fVar81 + DAT_005961d0._12_4_ +
                         (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar81);
                auVar64._0_8_ =
                     CONCAT44(-(uint)(auVar89._4_4_ <= 0.0),-(uint)(auVar89._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar64._8_4_ = -(uint)(auVar89._8_4_ <= 0.0) & 0x7fffffff;
                auVar64._12_4_ = -(uint)(auVar89._12_4_ <= 0.0) & 0x7fffffff;
                auVar84._4_4_ =
                     ~-(uint)(auVar89._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar60)) * 0.6931472 +
                             fVar103 +
                            (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) *
                                   fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                                -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) *
                              fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
                auVar84._0_4_ =
                     ~-(uint)(auVar89._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar59)) * 0.6931472 +
                             fVar93 + (((((((((fVar93 * 0.070376836 + -0.1151461) * fVar93 +
                                             0.116769984) * fVar93 + -0.12420141) * fVar93 +
                                           0.14249323) * fVar93 + -0.16668057) * fVar93 + 0.20000714
                                         ) * fVar93 + -0.24999994) * fVar93 + 0.3333333) * fVar93 +
                                      -0.5) * fVar93 * fVar93) * -2.0);
                auVar84._8_4_ =
                     ~-(uint)(auVar89._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar61)) * 0.6931472 +
                             fVar105 +
                            (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) *
                                   fVar105 + -0.12420141) * fVar105 + 0.14249323) * fVar105 +
                                -0.16668057) * fVar105 + 0.20000714) * fVar105 + -0.24999994) *
                              fVar105 + 0.3333333) * fVar105 + -0.5) * fVar105 * fVar105) * -2.0);
                auVar84._12_4_ =
                     ~-(uint)(auVar89._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar81 < 0.70710677) & (uint)fVar62)) * 0.6931472 +
                             fVar85 + (((((((((fVar85 * 0.070376836 + -0.1151461) * fVar85 +
                                             0.116769984) * fVar85 + -0.12420141) * fVar85 +
                                           0.14249323) * fVar85 + -0.16668057) * fVar85 + 0.20000714
                                         ) * fVar85 + -0.24999994) * fVar85 + 0.3333333) * fVar85 +
                                      -0.5) * fVar85 * fVar85) * -2.0);
                auVar69 = minps(auVar64 | auVar84,_DAT_005960e0);
                auVar69 = maxps(auVar69,_DAT_005960f0);
                fVar92 = auVar69._0_4_ * 1.442695 + fVar94;
                fVar93 = auVar69._4_4_ * 1.442695 + fVar95;
                fVar102 = auVar69._8_4_ * 1.442695 + fVar96;
                fVar103 = auVar69._12_4_ * 1.442695 + fVar97;
                fVar104 = (float)(int)fVar92;
                fVar105 = (float)(int)fVar93;
                fVar81 = (float)(int)fVar102;
                fVar85 = (float)(int)fVar103;
                fVar104 = fVar104 - (float)(-(uint)(fVar92 < fVar104) & (uint)fVar59);
                fVar105 = fVar105 - (float)(-(uint)(fVar93 < fVar105) & (uint)fVar60);
                fVar81 = fVar81 - (float)(-(uint)(fVar102 < fVar81) & (uint)fVar61);
                fVar85 = fVar85 - (float)(-(uint)(fVar103 < fVar85) & (uint)fVar62);
                fVar92 = auVar69._0_4_ - fVar104 * 0.6931472;
                fVar93 = auVar69._4_4_ - fVar105 * 0.6931472;
                fVar102 = auVar69._8_4_ - fVar81 * 0.6931472;
                fVar103 = auVar69._12_4_ - fVar85 * 0.6931472;
                auVar65._0_4_ =
                     fVar92 + fVar59 +
                     (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                       0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar94) * fVar92 * fVar92;
                auVar65._4_4_ =
                     fVar93 + fVar60 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar95) * fVar93 * fVar93;
                auVar65._8_4_ =
                     fVar102 + fVar61 +
                     (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                       + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar96) *
                     fVar102 * fVar102;
                auVar65._12_4_ =
                     fVar103 + fVar62 +
                     (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103
                       + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar97) *
                     fVar103 * fVar103;
                fVar104 = (float)((int)fVar104 * 0x800000 + (int)fVar59) * auVar65._0_4_ + fVar59;
                fVar105 = (float)((int)fVar105 * 0x800000 + (int)fVar60) * auVar65._4_4_ + fVar60;
                fVar81 = (float)((int)fVar81 * 0x800000 + (int)fVar61) * auVar65._8_4_ + fVar61;
                fVar85 = (float)((int)fVar85 * 0x800000 + (int)fVar62) * auVar65._12_4_ + fVar62;
                auVar16._4_4_ = fVar105;
                auVar16._0_4_ = fVar104;
                auVar16._8_4_ = fVar81;
                auVar16._12_4_ = fVar85;
                auVar69 = rcpps(auVar65,auVar16);
                fVar92 = auVar69._0_4_;
                fVar93 = auVar69._4_4_;
                fVar102 = auVar69._8_4_;
                fVar103 = auVar69._12_4_;
                auVar83._0_4_ =
                     fVar88 * (fVar92 + fVar92 + (float)DAT_005961d0 +
                              (2.0 - fVar104 * (fVar92 + fVar92)) * fVar92);
                auVar83._4_4_ =
                     fVar91 * (fVar93 + fVar93 + DAT_005961d0._4_4_ +
                              (2.0 - fVar105 * (fVar93 + fVar93)) * fVar93);
                auVar83._8_4_ =
                     auVar83._8_4_ *
                     (fVar102 + fVar102 + DAT_005961d0._8_4_ +
                     (2.0 - fVar81 * (fVar102 + fVar102)) * fVar102);
                auVar83._12_4_ =
                     auVar83._12_4_ *
                     (fVar103 + fVar103 + DAT_005961d0._12_4_ +
                     (2.0 - fVar85 * (fVar103 + fVar103)) * fVar103);
                break;
              case 6:
                fVar92 = **(float **)(&this->field_0xf8 + (long)p_Var10);
                fVar93 = (*(float **)(&this->field_0xf8 + (long)p_Var10))[1];
                auVar69._0_4_ = fVar92 * fVar88 + fVar93;
                auVar69._4_4_ = fVar92 * fVar91 + fVar93;
                auVar69._8_4_ = fVar92 * auVar83._8_4_ + fVar93;
                auVar69._12_4_ = fVar92 * auVar83._12_4_ + fVar93;
                auVar69 = maxps(auVar69,ZEXT816(0));
                auVar69 = minps(auVar69,auVar72);
                auVar83._0_4_ = fVar88 * auVar69._0_4_;
                auVar83._4_4_ = fVar91 * auVar69._4_4_;
                auVar83._8_4_ = auVar83._8_4_ * auVar69._8_4_;
                auVar83._12_4_ = auVar83._12_4_ * auVar69._12_4_;
              }
              if (iVar26 == 4) {
                *pauVar54 = auVar83;
                pauVar54 = pauVar54 + 1;
              }
              if (iVar26 == 1) {
                *(int *)*pauVar54 = auVar83._0_4_;
                *(int *)((long)*pauVar54 + lVar33 * 4) = auVar83._4_4_;
                *(int *)((long)*pauVar54 + lVar28 * 4) = auVar83._8_4_;
                *(int *)((long)*pauVar54 + (long)(iVar49 * 3) * 4) = auVar83._12_4_;
                pauVar54 = (undefined1 (*) [16])((long)*pauVar54 + 4);
              }
              local_178 = local_178 + 1;
              iVar44 = iVar44 + iVar43 * local_108.elempack;
              local_1b8 = (void *)((long)local_1b8 + lVar27 * 4);
              local_180 = local_180 + lVar27 * 4;
            } while (local_178 != lVar29);
          }
          local_1e0 = local_1e0 + 1;
        } while (local_1e0 != uVar45);
      }
      iVar25 = iVar25 + uVar45 * -4;
      local_70 = (ulong)(uint)(iVar25 / 2);
      if (1 < iVar25) {
        iVar49 = local_108.h * local_108.elempack;
        uVar48 = top_blob->w;
        local_40 = top_blob->data;
        local_48 = (long)(int)uVar48 * top_blob->elemsize;
        iVar25 = iVar43 * local_108.elempack;
        local_50 = (this->weight_data_tm).data;
        local_58 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
        bVar56 = local_108.elempack == 1;
        local_a8 = CONCAT44(local_a8._4_4_,iVar49) & 0xfffffffffffffffc;
        local_60 = (long)(int)(uVar45 * 4);
        local_68 = lVar40 * 4;
        local_b0 = 0;
        local_38 = local_70;
        do {
          if (0 < (int)uVar48) {
            lVar28 = local_60 + local_b0 * 2;
            pfVar53 = (float *)((local_60 + local_b0 * 2 + 1) * local_48 + (long)local_40);
            puVar47 = (undefined4 *)(lVar28 * local_48 + (long)local_40);
            uVar46 = (uint)lVar28;
            uVar24 = uVar46 + 3;
            if (-1 < (int)uVar46) {
              uVar24 = uVar46;
            }
            local_88._0_8_ = lVar28;
            pfVar31 = (float *)((((int)(uVar46 - (uVar24 & 0xfffffffc)) >> 1) + ((int)uVar24 >> 2))
                                * local_58 + (long)local_50);
            lVar28 = (long)local_108.w *
                     CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
            pfVar37 = *(float **)(&this->field_0xf8 + (long)p_Var10);
            local_158 = local_68 + (long)local_108.data;
            iVar26 = 0;
            local_a0 = local_108.data;
            local_1a8 = local_108.data;
            local_1e0 = 0;
            do {
              fVar59 = 0.0;
              fVar60 = 0.0;
              fVar61 = 0.0;
              fVar62 = 0.0;
              uVar76 = 0;
              if (lVar11 != 0) {
                uVar76 = *(undefined8 *)(lVar11 + local_88._0_8_ * 4);
              }
              uVar30 = 0;
              fVar94 = 0.0;
              fVar95 = 0.0;
              fVar96 = 0.0;
              fVar97 = 0.0;
              pfVar32 = pfVar31;
              if (3 < iVar49) {
                iVar44 = 0;
                do {
                  lVar33 = (iVar44 / iVar7) * lVar28;
                  pfVar38 = (float *)((long)local_a0 + lVar33 + (long)(iVar25 * (int)local_1e0) * 4)
                  ;
                  if ((iVar7 == 4) && (0 < iVar8)) {
                    pfVar38 = (float *)((long)local_a0 + lVar33 + (long)iVar26 * 4);
                    iVar42 = iVar8;
                    do {
                      fVar59 = fVar59 + *pfVar32 * *pfVar38;
                      fVar60 = fVar60 + pfVar32[1] * pfVar38[1];
                      fVar61 = fVar61 + pfVar32[2] * pfVar38[2];
                      fVar62 = fVar62 + pfVar32[3] * pfVar38[3];
                      fVar94 = fVar94 + *pfVar38 * pfVar32[4];
                      fVar95 = fVar95 + pfVar38[1] * pfVar32[5];
                      fVar96 = fVar96 + pfVar38[2] * pfVar32[6];
                      fVar97 = fVar97 + pfVar38[3] * pfVar32[7];
                      pfVar32 = pfVar32 + 8;
                      pfVar38 = pfVar38 + iVar9 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  iVar42 = iVar8;
                  if (0 < iVar8 && bVar56) {
                    do {
                      fVar59 = fVar59 + *pfVar32 * *pfVar38;
                      fVar60 = fVar60 + pfVar32[1] * pfVar38[lVar40];
                      fVar61 = fVar61 + pfVar32[2] * pfVar38[iVar23 * 2];
                      fVar62 = fVar62 + pfVar32[3] * pfVar38[iVar23 * 3];
                      fVar94 = fVar94 + *pfVar38 * pfVar32[4];
                      fVar95 = fVar95 + pfVar38[lVar40] * pfVar32[5];
                      fVar96 = fVar96 + pfVar38[iVar23 * 2] * pfVar32[6];
                      fVar97 = fVar97 + pfVar38[iVar23 * 3] * pfVar32[7];
                      pfVar32 = pfVar32 + 8;
                      pfVar38 = pfVar38 + lVar52;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  iVar42 = iVar44 + 7;
                  iVar44 = iVar44 + 4;
                } while (iVar42 < iVar49);
                uVar30 = local_a8 & 0xffffffff;
              }
              auVar78._0_4_ = (float)uVar76 + fVar61 + fVar59 + fVar62 + fVar60;
              auVar78._4_4_ = (float)((ulong)uVar76 >> 0x20) + fVar96 + fVar94 + fVar97 + fVar95;
              auVar78._8_4_ = fVar62 + fVar60 + 0.0 + fVar61 + fVar61;
              auVar78._12_4_ = fVar97 + fVar95 + 0.0 + fVar62 + fVar62;
              uVar46 = (uint)uVar30;
              if ((int)(uVar46 | 1) < iVar49) {
                lVar33 = local_158 + lVar28 * uVar30;
                pvVar34 = (void *)(lVar28 * uVar30 + (long)local_1a8);
                do {
                  if (0 < iVar8) {
                    lVar29 = 0;
                    iVar44 = iVar8;
                    do {
                      fVar59 = *(float *)((long)pvVar34 + lVar29);
                      fVar61 = auVar78._4_4_;
                      fVar62 = auVar78._8_4_;
                      fVar94 = auVar78._12_4_;
                      fVar60 = *(float *)(lVar33 + lVar29);
                      auVar78._0_4_ =
                           fVar60 * pfVar32[2] +
                           (float)*(undefined8 *)pfVar32 * fVar59 + auVar78._0_4_;
                      auVar78._4_4_ =
                           fVar60 * pfVar32[3] +
                           (float)((ulong)*(undefined8 *)pfVar32 >> 0x20) * fVar59 + fVar61;
                      auVar78._8_4_ = fVar60 * 0.0 + fVar59 * 0.0 + fVar62;
                      auVar78._12_4_ = fVar60 * 0.0 + fVar59 * 0.0 + fVar94;
                      pfVar32 = pfVar32 + 4;
                      lVar29 = lVar29 + lVar52 * 4;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  uVar30 = uVar30 + 2;
                  uVar46 = (uint)uVar30;
                  lVar33 = lVar33 + lVar28 * 2;
                  pvVar34 = (void *)((long)pvVar34 + lVar28 * 2);
                } while ((int)(uVar46 | 1) < iVar49);
              }
              if ((int)uVar46 < iVar49) {
                uVar30 = (ulong)uVar46;
                pfVar38 = (float *)(lVar28 * uVar30 + (long)local_1a8);
                do {
                  pfVar39 = pfVar38;
                  auVar72 = auVar78;
                  iVar44 = iVar8;
                  if (0 < iVar8) {
                    do {
                      fVar59 = *pfVar39;
                      auVar78._0_4_ = auVar72._0_4_ + fVar59 * *pfVar32;
                      auVar78._4_4_ = auVar72._4_4_ + fVar59 * pfVar32[1];
                      auVar78._8_4_ = auVar72._8_4_ + fVar59 * 0.0;
                      auVar78._12_4_ = auVar72._12_4_ + fVar59 * 0.0;
                      pfVar32 = pfVar32 + 2;
                      pfVar39 = pfVar39 + lVar52;
                      iVar44 = iVar44 + -1;
                      auVar72 = auVar78;
                    } while (iVar44 != 0);
                  }
                  uVar30 = uVar30 + 1;
                  pfVar38 = (float *)((long)pfVar38 + lVar28);
                } while ((int)uVar30 < iVar49);
              }
              iVar44 = (int)local_90 + -1;
              fVar59 = auVar78._0_4_;
              auVar72 = auVar78;
              switch(iVar44) {
              case 0:
                if (fVar59 <= 0.0) {
                  auVar17._12_4_ = 0;
                  auVar17._0_12_ = auVar78._4_12_;
                  auVar72 = auVar17 << 0x20;
                }
                break;
              case 1:
                auVar73 = ZEXT416(~-(uint)(0.0 < fVar59) & (uint)*pfVar37 |
                                  -(uint)(0.0 < fVar59) & 0x3f800000);
                goto LAB_00529654;
              case 2:
                fVar60 = pfVar37[1];
                fVar61 = *pfVar37;
                if (*pfVar37 <= fVar59) {
                  fVar61 = fVar59;
                }
                auVar72 = ZEXT416((uint)fVar61);
                if (fVar60 < fVar61) {
LAB_005296a2:
                  auVar72 = ZEXT416((uint)fVar60);
                }
                break;
              case 3:
                auVar57 = auVar78;
                if (88.37626 <= fVar59) {
                  auVar57._4_12_ = auVar78._4_12_;
                  auVar57._0_4_ = 0x42b0c0a5;
                }
                uVar46 = -(uint)(auVar57._0_4_ < -88.37626);
                fVar59 = expf((float)(uVar46 & 0x42b0c0a5 | ~uVar46 & (uint)-auVar57._0_4_));
                auVar72 = ZEXT416((uint)(1.0 / (fVar59 + 1.0)));
                break;
              case 4:
                fVar60 = expf(fVar59);
                fVar60 = logf(fVar60 + 1.0);
                fVar60 = tanhf(fVar60);
                auVar73._4_4_ = extraout_var._0_4_;
                auVar73._0_4_ = fVar60;
                auVar73._8_4_ = extraout_var._4_4_;
                auVar73._12_4_ = extraout_var._8_4_;
LAB_00529654:
                auVar72._4_12_ = auVar73._4_12_;
                auVar72._0_4_ = auVar73._0_4_ * fVar59;
                break;
              case 5:
                fVar60 = *pfVar37;
                fVar61 = -pfVar37[1] / fVar60;
                auVar72 = ZEXT816(0);
                if ((fVar61 <= fVar59) && (auVar72 = auVar78, fVar59 <= fVar61 + 1.0 / fVar60)) {
                  fVar60 = (fVar60 * fVar59 + pfVar37[1]) * fVar59;
                  goto LAB_005296a2;
                }
              }
              auVar77._4_4_ = auVar78._4_4_;
              auVar77._0_4_ = auVar77._4_4_;
              auVar77._8_4_ = auVar77._4_4_;
              auVar79._12_4_ = auVar77._4_4_;
              auVar79._0_12_ = auVar77;
              auVar80._4_12_ = auVar79._4_12_;
              switch(iVar44) {
              case 0:
                if (auVar77._4_4_ <= 0.0) {
                  auVar18._12_4_ = 0;
                  auVar18._0_12_ = auVar80._4_12_;
                  auVar79 = auVar18 << 0x20;
                }
              default:
                fVar59 = auVar79._0_4_;
                break;
              case 1:
                fVar59 = (float)(~-(uint)(0.0 < auVar77._4_4_) & (uint)*pfVar37 |
                                -(uint)(0.0 < auVar77._4_4_) & 0x3f800000) * auVar77._4_4_;
                break;
              case 2:
                fVar59 = pfVar37[1];
                fVar60 = *pfVar37;
                if (*pfVar37 <= auVar77._4_4_) {
                  fVar60 = auVar77._4_4_;
                }
                if (fVar60 <= fVar59) {
                  fVar59 = fVar60;
                }
                break;
              case 3:
                if (88.37626 <= auVar77._4_4_) {
                  auVar80._0_4_ = 0x42b0c0a5;
                  auVar77 = auVar80._0_12_;
                }
                uVar46 = -(uint)(auVar77._0_4_ < -88.37626);
                fVar59 = expf((float)(uVar46 & 0x42b0c0a5 | ~uVar46 & (uint)-auVar77._0_4_));
                fVar59 = 1.0 / (fVar59 + 1.0);
                break;
              case 4:
                fVar59 = expf(auVar77._4_4_);
                fVar59 = logf(fVar59 + 1.0);
                fVar59 = tanhf(fVar59);
                fVar59 = fVar59 * auVar77._4_4_;
                break;
              case 5:
                fVar60 = *pfVar37;
                fVar61 = -pfVar37[1] / fVar60;
                fVar59 = 0.0;
                if ((fVar61 <= auVar77._4_4_) &&
                   (fVar59 = auVar77._4_4_, auVar77._4_4_ <= fVar61 + 1.0 / fVar60)) {
                  fVar59 = (fVar60 * auVar77._4_4_ + pfVar37[1]) * auVar77._4_4_;
                }
              }
              *puVar47 = auVar72._0_4_;
              *pfVar53 = fVar59;
              puVar47 = puVar47 + 1;
              pfVar53 = pfVar53 + 1;
              local_1e0 = local_1e0 + 1;
              iVar26 = iVar26 + iVar25;
              local_158 = local_158 + lVar27 * 4;
              local_1a8 = (void *)((long)local_1a8 + lVar27 * 4);
            } while (local_1e0 != uVar48);
          }
          local_b0 = local_b0 + 1;
        } while (local_b0 != local_38);
      }
      iVar25 = uVar45 * 4 + (int)local_70 * 2;
      if (iVar25 < (int)local_b8) {
        pvVar34 = top_blob->data;
        iVar49 = top_blob->w;
        sVar12 = top_blob->elemsize;
        pvVar13 = (this->weight_data_tm).data;
        local_a0 = (void *)((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep);
        local_1b0 = (ulong)iVar25;
        local_a8 = lVar40 * 4;
        do {
          pvVar21 = local_108.data;
          if (0 < (int)local_98) {
            puVar47 = (undefined4 *)((long)iVar49 * sVar12 * local_1b0 + (long)pvVar34);
            uVar48 = (uint)local_1b0;
            uVar45 = uVar48 + 3;
            if (-1 < (int)uVar48) {
              uVar45 = uVar48;
            }
            pfVar37 = (float *)((long)(int)((uVar48 - (((uint)(local_1b0 >> 0x1f) & 1) + uVar48 &
                                                      0xfffffffe)) + ((int)uVar45 >> 2) +
                                           (int)(uVar48 - (uVar45 & 0xfffffffc)) / 2) *
                                (long)local_a0 + (long)pvVar13);
            lVar28 = (long)local_108.w *
                     CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
            pfVar53 = *(float **)(&this->field_0xf8 + (long)p_Var10);
            local_1a8 = (void *)(local_a8 + (long)local_108.data);
            iVar25 = 0;
            local_1b8 = local_108.data;
            local_1d8 = 0;
            do {
              if (lVar11 == 0) {
                fVar59 = 0.0;
              }
              else {
                fVar59 = *(float *)(lVar11 + local_1b0 * 4);
              }
              pfVar31 = pfVar37;
              if ((int)uVar22 < 4) {
                uVar30 = 0;
                fVar60 = 0.0;
                fVar61 = 0.0;
                fVar62 = 0.0;
                fVar94 = 0.0;
              }
              else {
                fVar60 = 0.0;
                fVar61 = 0.0;
                fVar62 = 0.0;
                fVar94 = 0.0;
                iVar26 = 0;
                do {
                  lVar33 = (iVar26 / iVar7) * lVar28;
                  if (iVar7 == 4 && 0 < iVar8) {
                    pfVar32 = (float *)((long)pvVar21 + lVar33 + (long)iVar25 * 4);
                    iVar44 = iVar8;
                    do {
                      fVar60 = fVar60 + *pfVar31 * *pfVar32;
                      fVar61 = fVar61 + pfVar31[1] * pfVar32[1];
                      fVar62 = fVar62 + pfVar31[2] * pfVar32[2];
                      fVar94 = fVar94 + pfVar31[3] * pfVar32[3];
                      pfVar31 = pfVar31 + 4;
                      pfVar32 = pfVar32 + iVar9 * 4;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  else {
                    pfVar32 = (float *)((long)pvVar21 +
                                       lVar33 + (long)(iVar7 * iVar43 * (int)local_1d8) * 4);
                  }
                  iVar44 = iVar8;
                  if (iVar7 == 1 && 0 < iVar8) {
                    do {
                      fVar60 = fVar60 + *pfVar32 * *pfVar31;
                      fVar61 = fVar61 + pfVar32[lVar40] * pfVar31[1];
                      fVar62 = fVar62 + pfVar32[iVar23 * 2] * pfVar31[2];
                      fVar94 = fVar94 + pfVar32[iVar23 * 3] * pfVar31[3];
                      pfVar31 = pfVar31 + 4;
                      pfVar32 = pfVar32 + lVar52;
                      iVar44 = iVar44 + -1;
                    } while (iVar44 != 0);
                  }
                  iVar44 = iVar26 + 7;
                  iVar26 = iVar26 + 4;
                } while (iVar44 < (int)uVar22);
                uVar30 = (ulong)uVar22 & 0xfffffffc;
              }
              auVar70._4_4_ = fVar94 + fVar61;
              auVar70._0_4_ = auVar70._4_4_;
              auVar70._8_4_ = auVar70._4_4_;
              auVar70._12_4_ = auVar70._4_4_;
              auVar71._4_12_ = auVar70._4_12_;
              auVar71._0_4_ = auVar70._4_4_ + fVar59 + fVar62 + fVar60;
              uVar48 = (uint)uVar30;
              if ((int)(uVar48 | 1) < (int)uVar22) {
                lVar33 = (long)local_1a8 + lVar28 * uVar30;
                pvVar35 = (void *)(lVar28 * uVar30 + (long)local_1b8);
                do {
                  auVar75 = auVar71;
                  if (0 < iVar8) {
                    lVar29 = 0;
                    iVar26 = iVar8;
                    do {
                      auVar74._4_4_ =
                           *(float *)(lVar33 + lVar29) *
                           (float)((ulong)*(undefined8 *)pfVar31 >> 0x20);
                      auVar74._0_4_ = auVar74._4_4_;
                      auVar74._8_4_ = auVar74._4_4_;
                      auVar74._12_4_ = auVar74._4_4_;
                      auVar75._4_12_ = auVar74._4_12_;
                      auVar75._0_4_ =
                           auVar74._4_4_ +
                           auVar71._0_4_ +
                           *(float *)((long)pvVar35 + lVar29) * (float)*(undefined8 *)pfVar31;
                      pfVar31 = pfVar31 + 2;
                      lVar29 = lVar29 + lVar52 * 4;
                      auVar71._4_4_ = auVar74._4_4_;
                      auVar71._0_4_ = auVar75._0_4_;
                      auVar71._8_4_ = auVar74._4_4_;
                      auVar71._12_4_ = auVar74._4_4_;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  auVar71 = auVar75;
                  uVar30 = uVar30 + 2;
                  uVar48 = (uint)uVar30;
                  lVar33 = lVar33 + lVar28 * 2;
                  pvVar35 = (void *)((long)pvVar35 + lVar28 * 2);
                } while ((int)(uVar48 | 1) < (int)uVar22);
              }
              else {
                auVar71._4_4_ = auVar70._4_4_;
                auVar71._8_4_ = auVar70._4_4_;
                auVar71._12_4_ = auVar70._4_4_;
              }
              if ((int)uVar48 < (int)uVar22) {
                uVar30 = (ulong)uVar48;
                pfVar32 = (float *)(lVar28 * uVar30 + (long)local_1b8);
                do {
                  pfVar38 = pfVar32;
                  iVar26 = iVar8;
                  if (0 < iVar8) {
                    do {
                      auVar71._0_4_ = auVar71._0_4_ + *pfVar31 * *pfVar38;
                      pfVar31 = pfVar31 + 1;
                      pfVar38 = pfVar38 + lVar52;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  uVar30 = uVar30 + 1;
                  pfVar32 = (float *)((long)pfVar32 + lVar28);
                } while ((int)uVar30 < (int)uVar22);
              }
              fVar59 = auVar71._0_4_;
              auVar58 = auVar71;
              switch((int)local_90) {
              case 1:
                if (fVar59 <= 0.0) {
                  auVar19._12_4_ = 0;
                  auVar19._0_12_ = auVar71._4_12_;
                  auVar58 = auVar19 << 0x20;
                }
                break;
              case 2:
                auVar58 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar59) & (uint)*pfVar53 |
                                                -(uint)(0.0 < fVar59) & 0x3f800000) * fVar59));
                break;
              case 3:
                if (fVar59 <= *pfVar53) {
                  auVar71._0_4_ = *pfVar53;
                }
                fVar59 = pfVar53[1];
                auVar58 = auVar71;
                if (fVar59 < auVar71._0_4_) {
LAB_00529dfc:
                  auVar58 = ZEXT416((uint)fVar59);
                }
                break;
              case 4:
                if (88.37626 <= fVar59) {
                  fVar59 = 88.37626;
                }
                fVar59 = expf((float)(-(uint)(fVar59 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar59 < -88.37626) & (uint)-fVar59));
                auVar58 = ZEXT416((uint)(1.0 / (fVar59 + 1.0)));
                break;
              case 5:
                local_88 = auVar71;
                fVar59 = expf(fVar59);
                fVar59 = logf(fVar59 + 1.0);
                fVar59 = tanhf(fVar59);
                auVar58._0_4_ = fVar59 * (float)local_88._0_4_;
                auVar58._4_12_ = extraout_var_00;
                break;
              case 6:
                fVar60 = *pfVar53;
                fVar61 = -pfVar53[1] / fVar60;
                auVar58 = ZEXT816(0);
                if ((fVar61 <= fVar59) && (auVar58 = auVar71, fVar59 <= fVar61 + 1.0 / fVar60)) {
                  fVar59 = (fVar60 * fVar59 + pfVar53[1]) * fVar59;
                  goto LAB_00529dfc;
                }
              }
              *puVar47 = auVar58._0_4_;
              puVar47 = puVar47 + 1;
              local_1d8 = local_1d8 + 1;
              iVar25 = iVar25 + iVar43 * iVar7;
              local_1a8 = (void *)((long)local_1a8 + lVar27 * 4);
              local_1b8 = (void *)((long)local_1b8 + lVar27 * 4);
            } while (local_1d8 != local_98);
          }
          local_1b0 = local_1b0 + 1;
        } while (local_1b0 != local_b8);
      }
      iVar43 = 0;
    }
  }
  piVar20 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}